

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall slang::parsing::Lexer::lexTrivia<false>(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  
LAB_00344943:
  pcVar2 = this->sourceBuffer;
  this->marker = pcVar2;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\t':
  case '\v':
  case '\f':
switchD_0034495d_caseD_9:
    this->sourceBuffer = pcVar2 + 1;
    scanWhitespace(this);
    goto LAB_00344943;
  case '\n':
    pcVar2 = pcVar2 + 1;
LAB_00344991:
    this->sourceBuffer = pcVar2;
    break;
  case '\r':
    this->sourceBuffer = pcVar2 + 1;
    if (pcVar2[1] == '\n') {
      pcVar2 = pcVar2 + 2;
      goto LAB_00344991;
    }
    break;
  default:
    if (cVar1 != '/') {
      if (cVar1 != ' ') {
        return;
      }
      goto switchD_0034495d_caseD_9;
    }
    if (pcVar2[1] == '*') {
      this->sourceBuffer = pcVar2 + 2;
      scanBlockComment(this);
    }
    else {
      if (pcVar2[1] != '/') {
        return;
      }
      this->sourceBuffer = pcVar2 + 2;
      scanLineComment(this);
    }
    goto LAB_00344943;
  }
  addTrivia(this,EndOfLine);
  goto LAB_00344943;
}

Assistant:

void Lexer::lexTrivia() {
    while (true) {
        mark();

        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                scanWhitespace();
                break;
            case '/':
                switch (peek(1)) {
                    case '/':
                        advance(2);
                        scanLineComment();
                        break;
                    case '*': {
                        advance(2);
                        scanBlockComment();
                        break;
                    }
                    default:
                        return;
                }
                break;
            case '\r':
                advance();
                consume('\n');
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            case '\n':
                advance();
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            default:
                return;
        }
    }
}